

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cc
# Opt level: O2

btree_result btree_iterator_init(btree *btree,btree_iterator *it,void *initial_key)

{
  btree_print_func *pbVar1;
  bid_t bVar2;
  btree_blk_ops *pbVar3;
  bnode_flag_t bVar4;
  undefined6 uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  uint16_t uVar8;
  uint32_t uVar9;
  void *pvVar10;
  bid_t *pbVar11;
  idx_t *piVar12;
  bnode **ppbVar13;
  void **ppvVar14;
  ulong uVar15;
  uint uVar16;
  
  (it->btree).aux = btree->aux;
  uVar6 = btree->ksize;
  uVar7 = btree->vsize;
  uVar8 = btree->height;
  uVar9 = btree->blksize;
  bVar2 = btree->root_bid;
  pvVar10 = btree->blk_handle;
  pbVar3 = btree->blk_ops;
  bVar4 = btree->root_flag;
  uVar5 = *(undefined6 *)&btree->field_0x2a;
  (it->btree).kv_ops = btree->kv_ops;
  (it->btree).root_flag = bVar4;
  *(undefined6 *)&(it->btree).field_0x2a = uVar5;
  (it->btree).blk_handle = pvVar10;
  (it->btree).blk_ops = pbVar3;
  (it->btree).ksize = uVar6;
  (it->btree).vsize = uVar7;
  (it->btree).height = uVar8;
  (it->btree).blksize = uVar9;
  (it->btree).root_bid = bVar2;
  pvVar10 = malloc((ulong)btree->ksize);
  it->curkey = pvVar10;
  pbVar1 = btree->kv_ops->init_kv_var;
  if (pbVar1 != (btree_print_func *)0x0) {
    (*pbVar1)(btree,pvVar10,(void *)0x0);
  }
  if (initial_key != (void *)0x0) {
    (*btree->kv_ops->set_key)(btree,it->curkey,initial_key);
  }
  uVar16 = (uint)btree->height;
  uVar15 = (ulong)((uint)btree->height * 8);
  pbVar11 = (bid_t *)malloc(uVar15);
  it->bid = pbVar11;
  piVar12 = (idx_t *)malloc((ulong)(uVar16 * 2));
  it->idx = piVar12;
  ppbVar13 = (bnode **)malloc(uVar15);
  it->node = ppbVar13;
  ppvVar14 = (void **)malloc(uVar15);
  it->addr = ppvVar14;
  for (uVar15 = 0; uVar15 < uVar16; uVar15 = uVar15 + 1) {
    it->bid[uVar15] = 0xffffffffffffffff;
    it->idx[uVar15] = 0xffff;
    it->node[uVar15] = (bnode *)0x0;
    it->addr[uVar15] = (void *)0x0;
    uVar16 = (uint)btree->height;
  }
  it->bid[(ulong)uVar16 - 1] = btree->root_bid;
  it->flags = '\0';
  return BTREE_RESULT_SUCCESS;
}

Assistant:

btree_result btree_iterator_init(struct btree *btree,
                                 struct btree_iterator *it, void *initial_key)
{
    int i;

    it->btree = *btree;
    it->curkey = (void *)mempool_alloc(btree->ksize);
    if (btree->kv_ops->init_kv_var) {
        btree->kv_ops->init_kv_var(btree, it->curkey, NULL);
    }
    if (initial_key) {
        // set initial key if exists
        //memcpy(it->curkey, initial_key, btree->ksize);
        btree->kv_ops->set_key(btree, it->curkey, initial_key);
    }else{
        // NULL initial key .. set minimum key (start from leftmost key)
        // replaced by kv_ops->init_kv_var
        //memset(it->curkey, 0, btree->ksize);
    }
    it->bid = (bid_t*)mempool_alloc(sizeof(bid_t) * btree->height);
    it->idx = (idx_t*)mempool_alloc(sizeof(idx_t) * btree->height);
    it->node = (struct bnode **)mempool_alloc(sizeof(struct bnode *)
                                                              * btree->height);
    it->addr = (void**)mempool_alloc(sizeof(void*) * btree->height);

    for (i=0;i<btree->height;++i){
        it->bid[i] = BTREE_BLK_NOT_FOUND;
        it->idx[i] = BTREE_IDX_NOT_FOUND;
        it->node[i] = NULL;
        it->addr[i] = NULL;
    }
    it->bid[btree->height-1] = btree->root_bid;
    it->flags = 0;

    return BTREE_RESULT_SUCCESS;
}